

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

bool __thiscall apngasm::APNGAsm::savePNGs(APNGAsm *this,string *outputDir)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference this_00;
  undefined1 local_48 [8];
  string outputPath;
  int i;
  int count;
  string *outputDir_local;
  APNGAsm *this_local;
  
  sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size(&this->_frames)
  ;
  outputPath.field_2._12_4_ = (undefined4)sVar3;
  for (outputPath.field_2._8_4_ = 0; (int)outputPath.field_2._8_4_ < (int)outputPath.field_2._12_4_;
      outputPath.field_2._8_4_ = outputPath.field_2._8_4_ + 1) {
    (**(code **)(*(long *)this->_listener + 0x40))
              (local_48,this->_listener,outputDir,outputPath.field_2._8_4_);
    bVar1 = (**(code **)(*(long *)this->_listener + 0x30))(this->_listener,local_48);
    if ((bVar1 & 1) == 0) {
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    else {
      this_00 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                          (&this->_frames,(long)(int)outputPath.field_2._8_4_);
      bVar2 = APNGFrame::save(this_00,(string *)local_48);
      if (bVar2) {
        (**(code **)(*(long *)this->_listener + 0x38))(this->_listener,local_48);
        bVar2 = false;
      }
      else {
        this_local._7_1_ = 0;
        bVar2 = true;
      }
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar2) goto LAB_001cef37;
  }
  this_local._7_1_ = 1;
LAB_001cef37:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool APNGAsm::savePNGs(const std::string& outputDir) const
  {
    const int count = _frames.size();
    for(int i = 0;  i < count;  ++i)
    {
      const std::string outputPath = _listener->onCreatePngPath(outputDir, i);

      if( !_listener->onPreSave(outputPath) )
        return false;

      if( !_frames[i].save(outputPath) )
        return false;

      _listener->onPostSave(outputPath);
    }
    return true;
  }